

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin_manager.c
# Opt level: O2

int plugin_manager_initialize
              (plugin_manager manager,char *name,char *environment_library_path,
              char *default_library_path,plugin_manager_interface iface,void *impl)

{
  int iVar1;
  set psVar2;
  size_t sVar3;
  char *pcVar4;
  plugin_loader_conflict ppVar5;
  size_t line;
  ulong __size;
  size_t sStack_1060;
  size_t length;
  char *local_1050;
  char name_1 [9];
  dynlink_library_path_str path;
  
  if (manager->name == (char *)0x0) {
    if (name == (char *)0x0) {
      pcVar4 = "Invalid plugin manager name";
      sStack_1060 = 0x3d;
LAB_0011a23a:
      log_write_impl_va("metacall",sStack_1060,"plugin_manager_initialize",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                        ,LOG_LEVEL_ERROR,pcVar4);
      return 1;
    }
    local_1050 = environment_library_path;
    sVar3 = strlen(name);
    __size = sVar3 + 1;
    if (__size < 2) {
      pcVar4 = "Invalid plugin manager name length";
      sStack_1060 = 0x45;
      goto LAB_0011a23a;
    }
    pcVar4 = (char *)malloc(__size);
    manager->name = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "Invalid plugin manager name allocation";
      sStack_1060 = 0x4e;
      goto LAB_0011a23a;
    }
    memcpy(pcVar4,name,__size);
    environment_library_path = local_1050;
  }
  manager->iface = iface;
  manager->impl = impl;
  if (manager->plugins == (set)0x0) {
    psVar2 = set_create(hash_callback_str,comparable_callback_str);
    manager->plugins = psVar2;
    if (psVar2 == (set)0x0) {
      pcVar4 = "Invalid plugin manager set initialization";
      line = 0x61;
      goto LAB_0011a20b;
    }
  }
  if (manager->library_path == (char *)0x0) {
    builtin_strncpy(name_1,"metacall",9);
    length = 0;
    pcVar4 = path;
    iVar1 = dynlink_library_path(name_1,pcVar4,&length);
    if (iVar1 != 0) {
      length = strlen(default_library_path);
      pcVar4 = default_library_path;
    }
    pcVar4 = environment_variable_path_create
                       (environment_library_path,pcVar4,length + 1,(size_t *)0x0);
    manager->library_path = pcVar4;
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "Invalid plugin manager library path initialization";
      line = 0x87;
      goto LAB_0011a20b;
    }
  }
  if (manager->l != (plugin_loader)0x0) {
    return 0;
  }
  ppVar5 = plugin_loader_create(manager);
  manager->l = ppVar5;
  if (ppVar5 != (plugin_loader_conflict)0x0) {
    return 0;
  }
  pcVar4 = "Invalid plugin manager loader initialization";
  line = 0x9f;
LAB_0011a20b:
  log_write_impl_va("metacall",line,"plugin_manager_initialize",
                    "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/plugin/source/plugin_manager.c"
                    ,LOG_LEVEL_ERROR,pcVar4);
  plugin_manager_destroy(manager);
  return 1;
}

Assistant:

int plugin_manager_initialize(plugin_manager manager, const char *name, const char *environment_library_path, const char *default_library_path, plugin_manager_interface iface, void *impl)
{
	/* Initialize the name */
	if (manager->name == NULL)
	{
		if (name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager name");
			return 1;
		}

		size_t name_size = strlen(name) + 1;

		if (name_size <= 1)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager name length");

			return 1;
		}

		manager->name = malloc(sizeof(char) * name_size);

		if (manager->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager name allocation");

			return 1;
		}

		memcpy(manager->name, name, name_size);
	}

	/* Copy manager interface and implementation */
	manager->iface = iface;
	manager->impl = impl;

	/* Allocate the set which maps the plugins by their name */
	if (manager->plugins == NULL)
	{
		manager->plugins = set_create(&hash_callback_str, &comparable_callback_str);

		if (manager->plugins == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager set initialization");

			plugin_manager_destroy(manager);

			return 1;
		}
	}

	/* Initialize the library path */
	if (manager->library_path == NULL)
	{
		const char name[] = "metacall"
#if (!defined(NDEBUG) || defined(DEBUG) || defined(_DEBUG) || defined(__DEBUG) || defined(__DEBUG__))
							"d"
#endif
			;

		dynlink_library_path_str path;
		size_t length = 0;

		/* The order of precedence is:
		* 1) Environment variable
		* 2) Dynamic link library path of the host library
		* 3) Default compile time path
		*/
		if (dynlink_library_path(name, path, &length) == 0)
		{
			default_library_path = path;
		}
		else
		{
			length = strlen(default_library_path);
		}

		manager->library_path = environment_variable_path_create(environment_library_path, default_library_path, length + 1, NULL);

		if (manager->library_path == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager library path initialization");

			plugin_manager_destroy(manager);

			return 1;
		}

		/* On Windows, pass the library path to the loader so it can find the dependencies of the plugins */
		/* For more information: https://github.com/metacall/core/issues/479 */
#if defined(WIN32) || defined(_WIN32)
		if (SetDllDirectoryA(manager->library_path) == FALSE)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Failed to register the DLL directory %s; plugins with other dependant DLLs may fail to load", manager->library_path);
		}
#endif
	}

	/* Initialize the plugin loader */
	if (manager->l == NULL)
	{
		manager->l = plugin_loader_create(manager);

		if (manager->l == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid plugin manager loader initialization");

			plugin_manager_destroy(manager);

			return 1;
		}
	}

	return 0;
}